

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O0

void zmq::set_ip_type_of_service(fd_t s_,int iptos_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_EDI;
  bool bVar4;
  char *errstr_1;
  char *errstr;
  int rc;
  undefined1 local_8 [4];
  int local_4;
  
  local_4 = in_EDI;
  iVar1 = setsockopt(in_EDI,0,1,local_8,4);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip.cpp"
            ,0xd9);
    fflush(_stderr);
    zmq_abort((char *)0x1e47ff);
  }
  iVar1 = setsockopt(local_4,0x29,0x43,local_8,4);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    bVar4 = true;
    if (*piVar2 != 0x5c) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 0x16;
    }
    if (!bVar4) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip.cpp"
              ,0xe4);
      fflush(_stderr);
      zmq_abort((char *)0x1e48b2);
    }
  }
  return;
}

Assistant:

void zmq::set_ip_type_of_service (fd_t s_, int iptos_)
{
    int rc = setsockopt (s_, IPPROTO_IP, IP_TOS,
                         reinterpret_cast<char *> (&iptos_), sizeof (iptos_));

#ifdef ZMQ_HAVE_WINDOWS
    wsa_assert (rc != SOCKET_ERROR);
#else
    errno_assert (rc == 0);
#endif

    //  Windows and Hurd do not support IPV6_TCLASS
#if !defined(ZMQ_HAVE_WINDOWS) && defined(IPV6_TCLASS)
    rc = setsockopt (s_, IPPROTO_IPV6, IPV6_TCLASS,
                     reinterpret_cast<char *> (&iptos_), sizeof (iptos_));

    //  If IPv6 is not enabled ENOPROTOOPT will be returned on Linux and
    //  EINVAL on OSX
    if (rc == -1) {
        errno_assert (errno == ENOPROTOOPT || errno == EINVAL);
    }
#endif
}